

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnWriter::HandleDefineLevels
          (ColumnWriter *this,ColumnWriterState *state,ColumnWriterState *parent,
          ValidityMask *validity,idx_t count,uint16_t define_value,uint16_t null_value)

{
  uint16_t uVar1;
  IOException *pIVar2;
  pointer puVar3;
  unsigned_short *puVar4;
  iterator iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  reference rVar9;
  unsigned_short local_62;
  vector<unsigned_short,std::allocator<unsigned_short>> *local_60;
  ColumnWriter *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_58 = this;
  local_62 = define_value;
  if (parent == (ColumnWriterState *)0x0) {
    if (*(long *)validity == 0) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_fill_insert
                (&(state->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                 (iterator)
                 (state->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish,count,&local_62);
    }
    else if (count != 0) {
      local_60 = (vector<unsigned_short,std::allocator<unsigned_short>> *)&state->definition_levels;
      uVar7 = 0;
      do {
        if (*(long *)validity == 0) {
          bVar8 = true;
        }
        else {
          bVar8 = (*(ulong *)(*(long *)validity + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f) & 1) != 0;
        }
        puVar4 = &null_value;
        if (bVar8 != false) {
          puVar4 = &local_62;
        }
        iVar5._M_current =
             (state->definition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (state->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>
            .super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>(local_60,iVar5,puVar4);
        }
        else {
          *iVar5._M_current = *puVar4;
          (state->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        state->null_count = state->null_count + (ulong)(bVar8 ^ 1);
        uVar7 = uVar7 + 1;
      } while (count != uVar7);
    }
    if ((local_58->can_have_nulls == false) && (state->null_count != 0)) {
      pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,
                 "Parquet writer: map key column is not allowed to contain NULL values","");
      duckdb::IOException::IOException(pIVar2,(string *)local_50);
      __cxa_throw(pIVar2,&IOException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar5._M_current =
         (state->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar7 = (long)iVar5._M_current -
            (long)(state->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start;
    puVar3 = (parent->definition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar7 < (ulong)((long)(parent->definition_levels).
                              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
      local_60 = (vector<unsigned_short,std::allocator<unsigned_short>> *)&state->definition_levels;
      uVar6 = 0;
      do {
        if (*(unsigned_short *)((long)puVar3 + uVar7) == 0xffff) {
          if ((*(long *)validity == 0) ||
             ((*(ulong *)(*(long *)validity + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)) {
            uVar1 = local_62;
            if (iVar5._M_current ==
                (state->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              puVar4 = &local_62;
              goto LAB_002496c8;
            }
          }
          else {
            if (local_58->can_have_nulls == false) {
              pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
              local_50[0] = local_40;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_50,
                         "Parquet writer: map key column is not allowed to contain NULL values","");
              duckdb::IOException::IOException(pIVar2,(string *)local_50);
              __cxa_throw(pIVar2,&IOException::typeinfo,std::runtime_error::~runtime_error);
            }
            state->null_count = state->null_count + 1;
            uVar1 = null_value;
            if (iVar5._M_current ==
                (state->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              puVar4 = &null_value;
LAB_002496c8:
              std::vector<unsigned_short,std::allocator<unsigned_short>>::
              _M_realloc_insert<unsigned_short_const&>(local_60,iVar5,puVar4);
              goto LAB_002496cd;
            }
          }
          *iVar5._M_current = uVar1;
          (state->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        else {
          if (iVar5._M_current ==
              (state->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_short,std::allocator<unsigned_short>>::
            _M_realloc_insert<unsigned_short_const&>
                      (local_60,iVar5,(unsigned_short *)((long)puVar3 + uVar7));
          }
          else {
            *iVar5._M_current = *(unsigned_short *)((long)puVar3 + uVar7);
            (state->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>
            .super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          state->parent_null_count = state->parent_null_count + 1;
        }
LAB_002496cd:
        if ((((parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
              super__Bit_iterator_base._M_p ==
              (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
              super__Bit_iterator_base._M_p) &&
            (*(uint *)((long)&(parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) == 0)
            ) || (rVar9 = vector<bool,_true>::get<true>(&parent->is_empty,(long)uVar7 >> 1),
                 (*rVar9._M_p & rVar9._M_mask) == 0)) {
          uVar6 = uVar6 + 1;
        }
        iVar5._M_current =
             (state->definition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        uVar7 = (long)iVar5._M_current -
                (long)(state->definition_levels).
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start;
        puVar3 = (parent->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar7 < (ulong)((long)(parent->definition_levels).
                                     super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3));
    }
  }
  return;
}

Assistant:

void ColumnWriter::HandleDefineLevels(ColumnWriterState &state, ColumnWriterState *parent, const ValidityMask &validity,
                                      const idx_t count, const uint16_t define_value, const uint16_t null_value) const {
	if (parent) {
		// parent node: inherit definition level from the parent
		idx_t vector_index = 0;
		while (state.definition_levels.size() < parent->definition_levels.size()) {
			idx_t current_index = state.definition_levels.size();
			if (parent->definition_levels[current_index] != PARQUET_DEFINE_VALID) {
				state.definition_levels.push_back(parent->definition_levels[current_index]);
				state.parent_null_count++;
			} else if (validity.RowIsValid(vector_index)) {
				state.definition_levels.push_back(define_value);
			} else {
				if (!can_have_nulls) {
					throw IOException("Parquet writer: map key column is not allowed to contain NULL values");
				}
				state.null_count++;
				state.definition_levels.push_back(null_value);
			}
			if (parent->is_empty.empty() || !parent->is_empty[current_index]) {
				vector_index++;
			}
		}
	} else {
		// no parent: set definition levels only from this validity mask
		if (validity.AllValid()) {
			state.definition_levels.insert(state.definition_levels.end(), count, define_value);
		} else {
			for (idx_t i = 0; i < count; i++) {
				const auto is_null = !validity.RowIsValid(i);
				state.definition_levels.emplace_back(is_null ? null_value : define_value);
				state.null_count += is_null;
			}
		}
		if (!can_have_nulls && state.null_count != 0) {
			throw IOException("Parquet writer: map key column is not allowed to contain NULL values");
		}
	}
}